

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O2

shared_ptr<QPDFObject> __thiscall
QPDF_Null::create(QPDF_Null *this,shared_ptr<QPDFObject> *parent,string_view *static_descr,
                 string *var_descr)

{
  QPDFObject *this_00;
  QPDF *a_qpdf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  QPDFObject::create<QPDF_Null>();
  this_00 = *(QPDFObject **)this;
  a_qpdf = ((parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->qpdf;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_50,(string *)var_descr);
  QPDFObject::setChildDescription
            (this_00,a_qpdf,(shared_ptr<QPDFObject> *)&local_60,static_descr,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDF_Null::create(
    std::shared_ptr<QPDFObject> parent, std::string_view const& static_descr, std::string var_descr)
{
    auto n = QPDFObject::create<QPDF_Null>();
    n->setChildDescription(parent->getQPDF(), parent, static_descr, var_descr);
    return n;
}